

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::php::EnumOrMessageSuffix_abi_cxx11_
          (string *__return_storage_ptr__,php *this,FieldDescriptor *field,bool is_descriptor)

{
  CppType CVar1;
  Descriptor *this_00;
  EnumDescriptor *this_01;
  undefined1 is_descriptor_00;
  allocator<char> local_b1;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  byte local_19;
  php *ppStack_18;
  bool is_descriptor_local;
  FieldDescriptor *field_local;
  string *psVar2;
  
  local_19 = (byte)field & 1;
  psVar2 = __return_storage_ptr__;
  ppStack_18 = this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  is_descriptor_00 = SUB81(psVar2,0);
  if (CVar1 == CPPTYPE_MESSAGE) {
    this_00 = FieldDescriptor::message_type((FieldDescriptor *)ppStack_18);
    MessageFullName_abi_cxx11_
              (&local_60,(php *)this_00,(Descriptor *)(ulong)(local_19 & 1),(bool)is_descriptor_00);
    std::operator+(&local_40,", \'",&local_60);
    std::operator+(__return_storage_ptr__,&local_40,"\'");
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)ppStack_18);
    if (CVar1 == CPPTYPE_ENUM) {
      this_01 = FieldDescriptor::enum_type((FieldDescriptor *)ppStack_18);
      EnumFullName_abi_cxx11_
                (&local_b0,(php *)this_01,(EnumDescriptor *)(ulong)(local_19 & 1),
                 (bool)is_descriptor_00);
      std::operator+(&local_90,", \'",&local_b0);
      std::operator+(__return_storage_ptr__,&local_90,"\'");
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_b1);
      std::allocator<char>::~allocator(&local_b1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EnumOrMessageSuffix(
    const FieldDescriptor* field, bool is_descriptor) {
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    return ", '" + MessageFullName(field->message_type(), is_descriptor) + "'";
  }
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
    return ", '" + EnumFullName(field->enum_type(), is_descriptor) + "'";
  }
  return "";
}